

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JupiterAce.cpp
# Opt level: O1

bool IsValidDeepThoughtData(Data *data)

{
  pointer puVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar3 = GetDeepThoughtDataOffset(data);
  if (iVar3 != 0) {
    puVar1 = (data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = *(int *)&(data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (int)puVar1;
    if (iVar3 != iVar4) {
      lVar5 = (long)iVar4 + -1;
      iVar4 = (int)lVar5;
      if (iVar3 < iVar4) {
        lVar6 = (long)iVar3;
        uVar2 = '\0';
        do {
          uVar2 = uVar2 + puVar1[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 < iVar4);
      }
      else {
        uVar2 = '\0';
      }
      return uVar2 == puVar1[lVar5];
    }
  }
  return false;
}

Assistant:

bool IsValidDeepThoughtData(const Data& data)
{
    auto offset = GetDeepThoughtDataOffset(data);
    if (!offset || offset == data.size())
        return false;

    uint8_t sum = 0;
    for (auto i = offset; i < data.size() - 1; ++i)
        sum += data[i];

    return sum == data[data.size() - 1];
}